

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

bool __thiscall crnlib::qdxt5::update_progress(qdxt5 *this,uint value,uint max_value)

{
  bool bVar1;
  int local_34;
  uint percentage;
  uint max_value_local;
  uint value_local;
  qdxt5 *this_local;
  
  if ((this->m_params).m_pProgress_func == (progress_callback_func)0x0) {
    this_local._7_1_ = true;
  }
  else {
    if (max_value == 0) {
      local_34 = 100;
    }
    else {
      local_34 = this->m_progress_start +
                 (value * this->m_progress_range + (max_value >> 1)) / max_value;
    }
    if (local_34 == this->m_prev_percentage_complete) {
      this_local._7_1_ = true;
    }
    else {
      this->m_prev_percentage_complete = local_34;
      bVar1 = (*(this->m_params).m_pProgress_func)
                        ((this->m_params).m_progress_start +
                         (local_34 * (this->m_params).m_progress_range) / 100,
                         (this->m_params).m_pProgress_data);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this->m_canceled = true;
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool qdxt5::update_progress(uint value, uint max_value)
    {
        if (!m_params.m_pProgress_func)
        {
            return true;
        }

        uint percentage = max_value ? (m_progress_start + (value * m_progress_range + (max_value / 2)) / max_value) : 100;
        if ((int)percentage == m_prev_percentage_complete)
        {
            return true;
        }
        m_prev_percentage_complete = percentage;

        if (!m_params.m_pProgress_func(m_params.m_progress_start + (percentage * m_params.m_progress_range) / 100U, m_params.m_pProgress_data))
        {
            m_canceled = true;
            return false;
        }

        return true;
    }